

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ApplySizeFullWithConstraint(ImGuiWindow *window,ImVec2 new_size)

{
  ImVec2 IVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImGuiSizeConstraintCallbackData local_38;
  
  pIVar2 = GImGui;
  if (GImGui->SetNextWindowSizeConstraint == true) {
    fVar6 = (GImGui->SetNextWindowSizeConstraintRect).Min.x;
    fVar7 = (GImGui->SetNextWindowSizeConstraintRect).Min.y;
    fVar8 = new_size.x;
    fVar5 = new_size.y;
    if ((fVar6 < 0.0) || (fVar9 = (GImGui->SetNextWindowSizeConstraintRect).Max.x, fVar9 < 0.0)) {
      fVar6 = (window->SizeFull).x;
    }
    else {
      if (fVar8 <= fVar9) {
        fVar9 = fVar8;
      }
      fVar6 = (float)(-(uint)(fVar8 < fVar6) & (uint)fVar6 | ~-(uint)(fVar8 < fVar6) & (uint)fVar9);
    }
    if ((fVar7 < 0.0) || (fVar8 = (GImGui->SetNextWindowSizeConstraintRect).Max.y, fVar8 < 0.0)) {
      fVar7 = (window->SizeFull).y;
    }
    else {
      if (fVar5 <= fVar8) {
        fVar8 = fVar5;
      }
      fVar7 = (float)(-(uint)(fVar5 < fVar7) & (uint)fVar7 | ~-(uint)(fVar5 < fVar7) & (uint)fVar8);
    }
    new_size.y = fVar7;
    new_size.x = fVar6;
    if (GImGui->SetNextWindowSizeConstraintCallback != (ImGuiSizeConstraintCallback)0x0) {
      local_38.UserData = GImGui->SetNextWindowSizeConstraintCallbackUserData;
      local_38.Pos = window->Pos;
      local_38.CurrentSize = window->SizeFull;
      local_38.DesiredSize = new_size;
      (*GImGui->SetNextWindowSizeConstraintCallback)(&local_38);
      new_size = local_38.DesiredSize;
    }
  }
  if ((window->Flags & 0x100040U) == 0) {
    IVar1 = (pIVar2->Style).WindowMinSize;
    fVar6 = IVar1.x;
    fVar7 = IVar1.y;
    uVar3 = -(uint)(fVar6 <= new_size.x);
    uVar4 = -(uint)(fVar7 <= new_size.y);
    new_size = (ImVec2)(CONCAT44((uint)new_size.y & uVar4,(uint)new_size.x & uVar3) |
                       CONCAT44(~uVar4 & (uint)fVar7,~uVar3 & (uint)fVar6));
  }
  window->SizeFull = new_size;
  return;
}

Assistant:

static void ApplySizeFullWithConstraint(ImGuiWindow* window, ImVec2 new_size)
{
    ImGuiContext& g = *GImGui;
    if (g.SetNextWindowSizeConstraint)
    {
        // Using -1,-1 on either X/Y axis to preserve the current size.
        ImRect cr = g.SetNextWindowSizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.SetNextWindowSizeConstraintCallback)
        {
            ImGuiSizeConstraintCallbackData data;
            data.UserData = g.SetNextWindowSizeConstraintCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.SetNextWindowSizeConstraintCallback(&data);
            new_size = data.DesiredSize;
        }
    }
    if (!(window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysAutoResize)))
        new_size = ImMax(new_size, g.Style.WindowMinSize);
    window->SizeFull = new_size;
}